

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<(ChArchiveOut *this,ChNameValue<bool> *bVal)

{
  char *local_28;
  bool *pbStack_20;
  char local_18;
  
  local_28 = bVal->_name;
  pbStack_20 = bVal->_value;
  local_18 = bVal->_flags;
  (*(this->super_ChArchive)._vptr_ChArchive[2])(this,&local_28);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }